

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O1

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenTypeGet_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,Type *type)

{
  Type local_28;
  
  if (type->base_type - BASE_TYPE_UTYPE < 0xc) {
    GenTypeBasic_abi_cxx11_(__return_storage_ptr__,this,type,true);
  }
  else if (type->base_type == BASE_TYPE_ARRAY) {
    local_28.base_type = type->element;
    local_28.struct_def = type->struct_def;
    local_28.enum_def = type->enum_def;
    local_28.fixed_length = type->fixed_length;
    local_28.element = BASE_TYPE_NONE;
    GenTypeGet_abi_cxx11_(__return_storage_ptr__,this,&local_28);
  }
  else {
    GenTypePointer_abi_cxx11_(__return_storage_ptr__,this,type);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeGet(const Type &type) const {
    return IsScalar(type.base_type)
               ? GenTypeBasic(type)
               : (IsArray(type) ? GenTypeGet(type.VectorType())
                                : GenTypePointer(type));
  }